

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcol.c
# Opt level: O3

int ffgcf(fitsfile *fptr,int datatype,int colnum,LONGLONG firstrow,LONGLONG firstelem,LONGLONG nelem
         ,void *array,char *nullarray,int *anynul,int *status)

{
  char cnulval [2];
  
  if (0 < *status) {
    return *status;
  }
  if (datatype < 0x1f) {
    switch(datatype) {
    case 0xb:
      ffgclb(fptr,colnum,firstrow,firstelem,nelem,1,2,'\0',(uchar *)array,nullarray,anynul,status);
      break;
    case 0xc:
      ffgclsb(fptr,colnum,firstrow,firstelem,nelem,1,2,'\0',(char *)array,nullarray,anynul,status);
      break;
    case 0xe:
      ffgcll(fptr,colnum,firstrow,firstelem,nelem,2,'\0',(char *)array,nullarray,anynul,status);
      break;
    case 0x10:
      ffgcls(fptr,colnum,firstrow,firstelem,nelem,2,cnulval,(char **)array,nullarray,anynul,status);
      break;
    case 0x14:
      ffgclui(fptr,colnum,firstrow,firstelem,nelem,1,2,0,(unsigned_short *)array,nullarray,anynul,
              status);
      break;
    case 0x15:
      ffgcli(fptr,colnum,firstrow,firstelem,nelem,1,2,0,(short *)array,nullarray,anynul,status);
      break;
    default:
      if (datatype == 1) {
        ffgcx(fptr,colnum,firstrow,firstelem,nelem,(char *)array,status);
        break;
      }
      if (datatype == 0x1e) {
        ffgcluk(fptr,colnum,firstrow,firstelem,nelem,1,2,0,(uint *)array,nullarray,anynul,status);
        break;
      }
    case 0xd:
    case 0xf:
    case 0x11:
    case 0x12:
    case 0x13:
switchD_00189500_caseD_d:
      *status = 0x19a;
    }
LAB_0018979d:
    return *status;
  }
  if (0x29 < datatype) {
    switch(datatype) {
    case 0x50:
      ffgclujj(fptr,colnum,firstrow,firstelem,nelem,1,2,0,(ULONGLONG *)array,nullarray,anynul,status
              );
      break;
    case 0x51:
      ffgcljj(fptr,colnum,firstrow,firstelem,nelem,1,2,0,(LONGLONG *)array,nullarray,anynul,status);
      break;
    case 0x52:
      ffgcld(fptr,colnum,firstrow,firstelem,nelem,1,2,0.0,(double *)array,nullarray,anynul,status);
      break;
    case 0x53:
      ffgcfc(fptr,colnum,firstrow,firstelem,nelem,(float *)array,nullarray,anynul,status);
      break;
    default:
      if (datatype == 0x2a) {
        ffgcle(fptr,colnum,firstrow,firstelem,nelem,1,2,0.0,(float *)array,nullarray,anynul,status);
        break;
      }
      if (datatype == 0xa3) {
        ffgcfm(fptr,colnum,firstrow,firstelem,nelem,(double *)array,nullarray,anynul,status);
        break;
      }
      goto switchD_00189500_caseD_d;
    }
    goto LAB_0018979d;
  }
  if (datatype == 0x1f) {
    ffgclk(fptr,colnum,firstrow,firstelem,nelem,1,2,0,(int *)array,nullarray,anynul,status);
    goto LAB_0018979d;
  }
  if (datatype == 0x28) {
    ffgcluj(fptr,colnum,firstrow,firstelem,nelem,1,2,0,(unsigned_long *)array,nullarray,anynul,
            status);
    goto LAB_0018979d;
  }
  if (datatype == 0x29) {
    ffgclj(fptr,colnum,firstrow,firstelem,nelem,1,2,0,(long *)array,nullarray,anynul,status);
    goto LAB_0018979d;
  }
  goto switchD_00189500_caseD_d;
}

Assistant:

int ffgcf(  fitsfile *fptr,   /* I - FITS file pointer                       */
            int  datatype,    /* I - datatype of the value                   */
            int  colnum,      /* I - number of column to write (1 = 1st col) */
            LONGLONG  firstrow,   /* I - first row to write (1 = 1st row)        */
            LONGLONG  firstelem,  /* I - first vector element to read (1 = 1st)  */
            LONGLONG nelem,       /* I - number of values to read                */
            void *array,      /* O - array of values that are returned       */
            char *nullarray,  /* O - array of null value flags               */
            int  *anynul,     /* O - set to 1 if any values are null; else 0 */
            int  *status)     /* IO - error status                           */
/*
  Read an array of values from a table column. The datatype of the
  input array is defined by the 2nd argument.  Data conversion
  and scaling will be performed if necessary (e.g, if the datatype of
  the FITS array is not the same as the array being read).
  ANYNUL is returned with a value of true if any pixels are undefined.
*/
{
    double nulval = 0.;
    char cnulval[2];

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (datatype == TBIT)
    {
      ffgcx(fptr, colnum, firstrow, firstelem, nelem, (char *) array, status);
    }
    else if (datatype == TBYTE)
    {
       ffgclb(fptr, colnum, firstrow, firstelem, nelem, 1, 2, (unsigned char )
              nulval, (unsigned char *) array, nullarray, anynul, status);
    }
    else if (datatype == TSBYTE)
    {
       ffgclsb(fptr, colnum, firstrow, firstelem, nelem, 1, 2, (signed char )
              nulval, (signed char *) array, nullarray, anynul, status);
    }
    else if (datatype == TUSHORT)
    {
        ffgclui(fptr, colnum, firstrow, firstelem, nelem, 1, 2,
               (unsigned short ) nulval,
               (unsigned short *) array, nullarray, anynul, status);
    }
    else if (datatype == TSHORT)
    {
        ffgcli(fptr, colnum, firstrow, firstelem, nelem, 1, 2, (short )
              nulval, (short *) array, nullarray, anynul, status);
    }
    else if (datatype == TUINT)
    {
        ffgcluk(fptr, colnum, firstrow, firstelem, nelem, 1, 2,
         (unsigned int ) nulval, (unsigned int *) array, nullarray, anynul,
         status);
    }
    else if (datatype == TINT)
    {
        ffgclk(fptr, colnum, firstrow, firstelem, nelem, 1, 2, (int )
            nulval, (int *) array, nullarray, anynul, status);
    }
    else if (datatype == TULONG)
    {
        ffgcluj(fptr, colnum, firstrow, firstelem, nelem, 1, 2,
               (unsigned long ) nulval, 
               (unsigned long *) array, nullarray, anynul, status);
    }
    else if (datatype == TLONG)
    {
        ffgclj(fptr, colnum, firstrow, firstelem, nelem, 1, 2, (long )
              nulval, (long *) array, nullarray, anynul, status);
    }
    else if (datatype == TULONGLONG)
    {
        ffgclujj(fptr, colnum, firstrow, firstelem, nelem, 1, 2, (ULONGLONG )
              nulval, (ULONGLONG *) array, nullarray, anynul, status);
    }
    else if (datatype == TLONGLONG)
    {
        ffgcljj(fptr, colnum, firstrow, firstelem, nelem, 1, 2, (LONGLONG )
              nulval, (LONGLONG *) array, nullarray, anynul, status);
    }
    else if (datatype == TFLOAT)
    {
      ffgcle(fptr, colnum, firstrow, firstelem, nelem, 1, 2, (float )
               nulval,(float *) array, nullarray, anynul, status);
    }
    else if (datatype == TDOUBLE)
    {
        ffgcld(fptr, colnum, firstrow, firstelem, nelem, 1, 2, 
              nulval, (double *) array, nullarray, anynul, status);
    }
    else if (datatype == TCOMPLEX)
    {
        ffgcfc(fptr, colnum, firstrow, firstelem, nelem,
           (float *) array, nullarray, anynul, status);
    }
    else if (datatype == TDBLCOMPLEX)
    {
        ffgcfm(fptr, colnum, firstrow, firstelem, nelem, 
           (double *) array, nullarray, anynul, status);
    }

    else if (datatype == TLOGICAL)
    {
        ffgcll(fptr, colnum, firstrow, firstelem, nelem, 2, (char ) nulval,
          (char *) array, nullarray, anynul, status);
    }
    else if (datatype == TSTRING)
    {
        ffgcls(fptr, colnum, firstrow, firstelem, nelem, 2, 
             cnulval, (char **) array, nullarray, anynul, status);
    }
    else
      *status = BAD_DATATYPE;

    return(*status);
}